

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void Ifn_NtkMatchPrintPerm(word Perm,int nInps)

{
  byte bVar1;
  
  if (nInps < 0x11) {
    if (0 < nInps) {
      bVar1 = 0;
      do {
        putchar(((uint)(Perm >> (bVar1 & 0x3f)) & 0xf) + 0x61);
        bVar1 = bVar1 + 4;
        nInps = nInps + -1;
      } while (nInps != 0);
    }
    putchar(10);
    return;
  }
  __assert_fail("nInps <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                ,0x52b,"void Ifn_NtkMatchPrintPerm(word, int)");
}

Assistant:

void Ifn_NtkMatchPrintPerm( word Perm, int nInps )
{
    int i;
    assert( nInps <= 16 );
    for ( i = 0; i < nInps; i++ )
        printf( "%c", 'a' + Abc_TtGetHex(&Perm, i) );
    printf( "\n" );
}